

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O2

void nn_bipc_start_accepting(nn_bipc *self)

{
  nn_aipc *self_00;
  
  if (self->aipc == (nn_aipc *)0x0) {
    self_00 = (nn_aipc *)nn_alloc_(0x730);
    self->aipc = self_00;
    if (self_00 != (nn_aipc *)0x0) {
      nn_aipc_init(self_00,2,self->ep,&self->fsm);
      nn_aipc_start(self->aipc,&self->usock);
      return;
    }
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
            ,0x15d);
  }
  else {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->aipc == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
            ,0x159);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_bipc_start_accepting (struct nn_bipc *self)
{
    nn_assert (self->aipc == NULL);

    /*  Allocate new aipc state machine. */
    self->aipc = nn_alloc (sizeof (struct nn_aipc), "aipc");
    alloc_assert (self->aipc);
    nn_aipc_init (self->aipc, NN_BIPC_SRC_AIPC, self->ep, &self->fsm);

    /*  Start waiting for a new incoming connection. */
    nn_aipc_start (self->aipc, &self->usock);
}